

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O1

DecoderResult *
ZXing::Pdf417::DecodeCodewords
          (DecoderResult *__return_storage_ptr__,vector<int,_std::allocator<int>_> *codewords,
          int numECCodewords,vector<int,_std::allocator<int>_> *erasures)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  double dVar6;
  pointer psVar7;
  pointer psVar8;
  undefined8 uVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint extraout_EAX;
  uint uVar14;
  uint uVar15;
  undefined8 *puVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  size_type __n;
  ulong uVar20;
  ulong uVar21;
  ModulusGF *pMVar22;
  int *piVar23;
  int iVar24;
  ulong uVar25;
  uint __len;
  long lVar26;
  bool bVar27;
  bool bVar28;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar29;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar30;
  vector<int,_std::allocator<int>_> formalDerivativeCoefficients;
  vector<int,_std::allocator<int>_> errorLocations;
  ModulusPoly rLastLast;
  vector<int,_std::allocator<int>_> S;
  ModulusPoly tLastLast;
  ModulusPoly rLast;
  ModulusPoly syndrome;
  ModulusPoly poly;
  undefined1 local_408 [24];
  pointer piStack_3f0;
  undefined1 local_3e8 [24];
  pointer local_3d0;
  ModulusPoly local_3c8;
  ModulusPoly local_3a8;
  ModulusPoly local_388;
  ModulusPoly local_368;
  vector<int,_std::allocator<int>_> *local_348;
  uint local_33c;
  ModulusGF *local_338;
  vector<int,_std::allocator<int>_> local_330;
  ModulusPoly local_318;
  ModulusPoly local_2f8;
  ModulusPoly local_2d8;
  ModulusPoly local_2b8;
  vector<int,_std::allocator<int>_> local_290;
  ModulusPoly local_278;
  DecoderResult *local_258;
  undefined1 local_250 [56];
  _Alloc_hider local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  ModulusPoly local_180;
  ModulusPoly local_160;
  ModulusGF *local_140;
  undefined8 local_138;
  undefined1 local_130 [33];
  undefined7 uStack_10f;
  undefined4 local_107;
  undefined2 local_103;
  char local_101;
  ModulusGF *local_100;
  ModulusGF *local_f8;
  undefined1 local_f0 [24];
  ModulusGF *local_d8;
  pointer local_c8;
  Error local_c0;
  Error local_90;
  Error local_60;
  
  if ((codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (codewords->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_f8 = (ModulusGF *)0x0;
    paVar1 = &local_60._msg.field_2;
    local_60._msg.field_2._M_local_buf[0] = '\0';
    local_60._msg.field_2._M_allocated_capacity._1_7_ = local_f0._1_7_;
    local_60._msg._M_string_length = 0;
    local_f0[0] = 0;
    local_60._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_60._line = 0x23c;
    local_60._type = Format;
    local_100 = (ModulusGF *)local_f0;
    local_60._msg._M_dataplus._M_p = (pointer)paVar1;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._msg._M_dataplus._M_p,
                      CONCAT71(local_60._msg.field_2._M_allocated_capacity._1_7_,
                               local_60._msg.field_2._M_local_buf[0]) + 1);
    }
    if (local_100 == (ModulusGF *)local_f0) {
      return __return_storage_ptr__;
    }
    lVar26 = CONCAT71(local_f0._1_7_,local_f0[0]);
    pMVar22 = local_100;
  }
  else {
    if (((uint)numECCodewords < 0x201) &&
       ((int)((ulong)((long)(erasures->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(erasures->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start) >> 2) <= numECCodewords / 2 + 3)) {
      local_258 = __return_storage_ptr__;
      GetModulusGF();
      local_348 = codewords;
      ModulusPoly::ModulusPoly(&local_160,&GetModulusGF::field,codewords);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_290,(ulong)(uint)numECCodewords,(allocator_type *)local_250);
      bVar28 = true;
      if (0 < numECCodewords) {
        lVar26 = 0;
        bVar27 = false;
        uVar18 = (ulong)(uint)numECCodewords;
        do {
          if ((ulong)((long)GetModulusGF::field._expTable.
                            super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)GetModulusGF::field._expTable.
                            super__Vector_base<short,_std::allocator<short>_>._M_impl.
                            super__Vector_impl_data._M_start >> 1) <= uVar18) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar18);
          }
          iVar12 = ModulusPoly::evaluateAt
                             (&local_160,
                              (int)GetModulusGF::field._expTable.
                                   super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar18]);
          *(int *)((long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar26) = iVar12;
          if (iVar12 != 0) {
            bVar27 = true;
          }
          lVar26 = lVar26 + 4;
          bVar5 = 1 < (long)uVar18;
          uVar18 = uVar18 - 1;
        } while (bVar5);
        if (bVar27) {
          ModulusPoly::ModulusPoly(&local_180,&GetModulusGF::field,&local_290);
          local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_368._field = (ModulusGF *)0x0;
          local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2b8._field = (ModulusGF *)0x0;
          local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ModulusGF::buildMonomial(&local_2f8,&GetModulusGF::field,numECCodewords,1);
          local_338 = local_180._field;
          std::vector<int,_std::allocator<int>_>::vector(&local_330,&local_180._coefficients);
          GetModulusGF();
          piVar4 = local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          piVar3 = local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          piVar2 = local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar22 = local_2f8._field;
          if ((int)((ulong)((long)local_2f8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_2f8._coefficients.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2) <
              (int)((ulong)((long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
            local_2f8._field = local_338;
            local_338 = pMVar22;
            local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = piVar2;
            local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = piVar3;
            local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = piVar4;
          }
          local_250._0_8_ = local_2f8._field;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_250 + 8),&local_2f8._coefficients);
          local_408._0_8_ = local_338;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_408 + 8),&local_330);
          local_3e8._0_8_ = GetModulusGF::field._zero._field;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)(local_3e8 + 8),
                     &GetModulusGF::field._zero._coefficients);
          local_3c8._field = GetModulusGF::field._one._field;
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_3c8._coefficients,&GetModulusGF::field._one._coefficients);
          local_33c = (uint)numECCodewords >> 1;
          if ((int)local_33c < (int)((ulong)(local_408._16_8_ - local_408._8_8_) >> 2)) {
            do {
              local_388._field = (ModulusGF *)local_250._0_8_;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_388._coefficients,
                         (vector<int,_std::allocator<int>_> *)(local_250 + 8));
              local_278._field = (ModulusGF *)local_3e8._0_8_;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_278._coefficients,
                         (vector<int,_std::allocator<int>_> *)(local_3e8 + 8));
              local_250._0_8_ = local_408._0_8_;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_250 + 8),
                         (vector<int,_std::allocator<int>_> *)(local_408 + 8));
              local_3e8._0_8_ = local_3c8._field;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_3e8 + 8),
                         &local_3c8._coefficients);
              if (local_250._16_8_ == local_250._8_8_) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              if (*(int *)local_250._8_8_ == 0) {
                if (local_278._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_278._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_278._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_278._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_388._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_388._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_388._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                bVar28 = false;
                goto LAB_001787ce;
              }
              local_408._0_8_ = local_388._field;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)(local_408 + 8),
                         &local_388._coefficients);
              local_318._field = GetModulusGF::field._zero._field;
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_318._coefficients,&GetModulusGF::field._zero._coefficients);
              uVar18 = (long)(local_250._16_8_ - local_250._8_8_) >> 2;
              uVar20 = (local_250._16_8_ - local_250._8_8_) * -0x40000000 >> 0x20;
              if (!CARRY8(uVar20,uVar18)) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              iVar12 = ModulusGF::inverse(&GetModulusGF::field,
                                          *(int *)(local_250._8_8_ + (uVar20 + uVar18) * 4));
              uVar20 = local_408._16_8_ - local_408._8_8_;
              uVar25 = uVar20 >> 2;
              uVar18 = (ulong)(local_250._16_8_ - local_250._8_8_) >> 2;
              if ((int)uVar18 <= (int)uVar25) {
                do {
                  if (local_408._16_8_ == local_408._8_8_) {
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
                  }
                  if (*(int *)local_408._8_8_ == 0) break;
                  uVar21 = (long)(uVar20 * -0x40000000) >> 0x20;
                  if (!CARRY8(uVar21,(long)uVar20 >> 2)) {
                    std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
                  }
                  iVar19 = 0;
                  if ((iVar12 != 0) &&
                     (*(int *)(local_408._8_8_ + (uVar21 + ((long)uVar20 >> 2)) * 4) != 0)) {
                    iVar19 = (int)GetModulusGF::field._expTable.
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start
                                  [(long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start
                                         [*(int *)(local_408._8_8_ +
                                                  (uVar21 + ((long)uVar20 >> 2)) * 4)] +
                                   (long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar12]];
                  }
                  iVar24 = (int)uVar25 - (int)uVar18;
                  ModulusGF::buildMonomial(&local_2d8,&GetModulusGF::field,iVar24,iVar19);
                  ModulusPoly::add(&local_3a8,&local_318,&local_2d8);
                  piVar3 = local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  piVar2 = local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  local_318._field = local_3a8._field;
                  local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
                  local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_finish;
                  local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (int *)0x0;
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (int *)0x0;
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((ModulusGF *)piVar2 != (ModulusGF *)0x0) {
                    operator_delete(piVar2,(long)piVar3 - (long)piVar2);
                  }
                  if (local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (int *)0x0) {
                    operator_delete(local_3a8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_3a8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_3a8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_2d8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_2d8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_2d8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  ModulusPoly::multiplyByMonomial(&local_2d8,(ModulusPoly *)local_250,iVar24,iVar19)
                  ;
                  ModulusPoly::subtract(&local_3a8,(ModulusPoly *)local_408,&local_2d8);
                  piVar2 = piStack_3f0;
                  uVar9 = local_408._8_8_;
                  local_408._0_8_ = local_3a8._field;
                  local_408._8_8_ =
                       local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
                  local_408._16_8_ =
                       local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_finish;
                  piStack_3f0 = local_3a8._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage;
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  if ((int *)uVar9 != (int *)0x0) {
                    operator_delete((void *)uVar9,(long)piVar2 - uVar9);
                  }
                  if ((ModulusGF *)
                      local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (ModulusGF *)0x0) {
                    operator_delete(local_3a8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_3a8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_3a8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  if (local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_2d8._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start,
                                    (long)local_2d8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage -
                                    (long)local_2d8._coefficients.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  uVar20 = local_408._16_8_ - local_408._8_8_;
                  uVar25 = uVar20 >> 2;
                  uVar18 = (ulong)(local_250._16_8_ - local_250._8_8_) >> 2;
                } while ((int)uVar18 <= (int)uVar25);
              }
              ModulusPoly::multiply
                        ((ModulusPoly *)(local_f0 + 0x10),&local_318,(ModulusPoly *)local_3e8);
              ModulusPoly::subtract(&local_2d8,(ModulusPoly *)(local_f0 + 0x10),&local_278);
              ModulusPoly::negative(&local_3a8,&local_2d8);
              piVar3 = local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
              piVar2 = local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start;
              local_3c8._field = local_3a8._field;
              local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((ModulusGF *)piVar2 != (ModulusGF *)0x0) {
                operator_delete(piVar2,(long)piVar3 - (long)piVar2);
              }
              if ((ModulusGF *)
                  local_3a8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (ModulusGF *)0x0) {
                operator_delete(local_3a8._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_3a8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_2d8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2d8._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_2d8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2d8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_d8 != (ModulusGF *)0x0) {
                operator_delete(local_d8,(long)local_c8 - (long)local_d8);
              }
              if ((ModulusGF *)
                  local_318._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (ModulusGF *)0x0) {
                operator_delete(local_318._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_318._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_318._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_278._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_278._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_278._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_278._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_388._coefficients.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_388._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_388._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
            } while ((int)local_33c < (int)((ulong)(local_408._16_8_ - local_408._8_8_) >> 2));
          }
          lVar26 = (long)local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          if (local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       lVar26 + -1);
          }
          iVar12 = *(int *)((long)local_3c8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar26 * 4 + -4);
          bVar28 = iVar12 != 0;
          if (bVar28) {
            iVar12 = ModulusGF::inverse(&GetModulusGF::field,iVar12);
            ModulusPoly::multiply(&local_388,&local_3c8,iVar12);
            piVar3 = local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            piVar2 = local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_368._field = local_388._field;
            local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (piVar2 != (pointer)0x0) {
              operator_delete(piVar2,(long)piVar3 - (long)piVar2);
            }
            if (local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_388._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_388._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            ModulusPoly::multiply(&local_388,(ModulusPoly *)local_408,iVar12);
            piVar3 = local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            piVar2 = local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_2b8._field = local_388._field;
            local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (piVar2 != (pointer)0x0) {
              operator_delete(piVar2,(long)piVar3 - (long)piVar2);
            }
            if (local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_388._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_388._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_388._coefficients.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            bVar28 = true;
          }
LAB_001787ce:
          if ((ModulusGF *)
              local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (ModulusGF *)0x0) {
            operator_delete(local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_3c8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_3c8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if ((ModulusGF *)local_3e8._8_8_ != (ModulusGF *)0x0) {
            operator_delete((void *)local_3e8._8_8_,(long)local_3d0 - local_3e8._8_8_);
          }
          if ((int *)local_408._8_8_ != (int *)0x0) {
            operator_delete((void *)local_408._8_8_,(long)piStack_3f0 - local_408._8_8_);
          }
          if ((int *)local_250._8_8_ != (int *)0x0) {
            operator_delete((void *)local_250._8_8_,local_250._24_8_ - local_250._8_8_);
          }
          if (local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_330.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2f8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2f8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2f8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (bVar28) {
            local_3e8._0_8_ = (ModulusGF *)0x0;
            local_3e8._8_8_ = (ModulusGF *)0x0;
            local_3e8._16_8_ = (pointer)0x0;
            GetModulusGF();
            iVar12 = (int)((ulong)((long)local_368._coefficients.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)local_368._coefficients.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            iVar19 = iVar12 + -1;
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)local_3e8,(long)iVar19);
            iVar24 = 0;
            if ((1 < iVar12) && (1 < GetModulusGF::field._modulus)) {
              iVar24 = 0;
              iVar12 = 1;
              do {
                iVar13 = ModulusPoly::evaluateAt(&local_368,iVar12);
                if (iVar13 == 0) {
                  iVar13 = ModulusGF::inverse(&GetModulusGF::field,iVar12);
                  ((int *)local_3e8._0_8_)[iVar24] = iVar13;
                  iVar24 = iVar24 + 1;
                }
                iVar12 = iVar12 + 1;
              } while ((iVar12 < GetModulusGF::field._modulus) && (iVar24 < iVar19));
            }
            if (iVar24 == iVar19) {
              GetModulusGF();
              uVar18 = (long)local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start;
              __n = (long)(uVar18 * 0x40000000 + -0x100000000) >> 0x20;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_408,__n,
                         (allocator_type *)local_250);
              psVar8 = GetModulusGF::field._logTable.
                       super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              psVar7 = GetModulusGF::field._expTable.
                       super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar14 = (uint)(uVar18 >> 2);
              if (1 < (int)uVar14) {
                uVar18 = (long)local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2;
                piVar23 = (int *)local_408._0_8_ + __n;
                uVar20 = 1;
                lVar26 = -0x200000000;
                do {
                  piVar23 = piVar23 + -1;
                  if (!CARRY8(lVar26 >> 0x20,uVar18)) {
                    std::__throw_out_of_range_fmt
                              (
                              "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              );
                  }
                  if ((long)local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[(lVar26 >> 0x20) + uVar18] == 0
                     ) {
                    iVar12 = 0;
                  }
                  else {
                    iVar12 = (int)psVar7[(long)psVar8[uVar20] +
                                         (long)psVar8[local_368._coefficients.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [(lVar26 >> 0x20) + uVar18]]];
                  }
                  *piVar23 = iVar12;
                  uVar20 = uVar20 + 1;
                  lVar26 = lVar26 + -0x100000000;
                } while ((uVar14 & 0x7fffffff) != uVar20);
              }
              ModulusPoly::ModulusPoly
                        ((ModulusPoly *)local_250,&GetModulusGF::field,
                         (vector<int,_std::allocator<int>_> *)local_408);
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&local_3c8,
                         (long)(local_3e8._8_8_ - local_3e8._0_8_) >> 2,(allocator_type *)&local_388
                        );
              uVar29 = extraout_XMM0_Da;
              uVar30 = extraout_XMM0_Db;
              if ((ModulusGF *)
                  local_3c8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != local_3c8._field) {
                uVar18 = 0;
                do {
                  iVar19 = ModulusGF::inverse(&GetModulusGF::field,((int *)local_3e8._0_8_)[uVar18])
                  ;
                  iVar24 = ModulusPoly::evaluateAt(&local_2b8,iVar19);
                  iVar12 = -iVar24;
                  if (GetModulusGF::field._modulus - iVar24 < GetModulusGF::field._modulus) {
                    iVar12 = GetModulusGF::field._modulus - iVar24;
                  }
                  iVar19 = ModulusPoly::evaluateAt((ModulusPoly *)local_250,iVar19);
                  iVar24 = ModulusGF::inverse(&GetModulusGF::field,iVar19);
                  iVar19 = 0;
                  if ((iVar12 != 0) && (iVar19 = 0, iVar24 != 0)) {
                    iVar19 = (int)GetModulusGF::field._expTable.
                                  super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                  super__Vector_impl_data._M_start
                                  [(long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar12] +
                                   (long)GetModulusGF::field._logTable.
                                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar24]];
                  }
                  (&(local_3c8._field)->_modulus)[uVar18] = iVar19;
                  uVar18 = uVar18 + 1;
                  uVar29 = extraout_XMM0_Da_00;
                  uVar30 = extraout_XMM0_Db_00;
                } while (uVar18 < (ulong)((long)local_3c8._coefficients.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start -
                                          (long)local_3c8._field >> 2));
              }
              if ((int *)local_250._8_8_ != (int *)0x0) {
                operator_delete((void *)local_250._8_8_,local_250._24_8_ - local_250._8_8_);
                uVar29 = extraout_XMM0_Da_01;
                uVar30 = extraout_XMM0_Db_01;
              }
              if ((ModulusGF *)local_408._0_8_ != (ModulusGF *)0x0) {
                operator_delete((void *)local_408._0_8_,local_408._16_8_ - local_408._0_8_);
                uVar29 = extraout_XMM0_Da_02;
                uVar30 = extraout_XMM0_Db_02;
              }
              bVar28 = local_3e8._8_8_ == local_3e8._0_8_;
              if (!bVar28) {
                piVar2 = (local_348->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                piVar3 = (local_348->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar18 = 0;
                do {
                  dVar6 = ModulusGF::log(&GetModulusGF::field,(double)CONCAT44(uVar30,uVar29));
                  uVar29 = SUB84(dVar6,0);
                  uVar30 = (undefined4)((ulong)dVar6 >> 0x20);
                  uVar14 = ~extraout_EAX + (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
                  if ((int)uVar14 < 0) break;
                  piVar4 = (local_348->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar19 = piVar4[uVar14] - (&(local_3c8._field)->_modulus)[uVar18];
                  iVar12 = iVar19 + GetModulusGF::field._modulus;
                  if (iVar12 < GetModulusGF::field._modulus) {
                    iVar19 = iVar12;
                  }
                  piVar4[uVar14] = iVar19;
                  uVar18 = uVar18 + 1;
                  bVar27 = uVar18 < (ulong)((long)(local_3e8._8_8_ - local_3e8._0_8_) >> 2);
                  bVar28 = !bVar27;
                } while (bVar27);
              }
              if (local_3c8._field != (ModulusGF *)0x0) {
                operator_delete(local_3c8._field,
                                (long)local_3c8._coefficients.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)local_3c8._field);
              }
            }
            else {
              bVar28 = false;
            }
            if ((ModulusGF *)local_3e8._0_8_ != (ModulusGF *)0x0) {
              operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ - local_3e8._0_8_);
            }
          }
          else {
            bVar28 = false;
          }
          if (local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_368._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_368._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_368._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_180._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_180._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_180._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
        }
      }
      if (local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_160._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      __return_storage_ptr__ = local_258;
      pvVar10 = local_348;
      if (bVar28) {
        piVar23 = (local_348->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar18 = (long)(local_348->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar23;
        if (0xf < uVar18) {
          iVar12 = (int)(uVar18 >> 2);
          if (*piVar23 <= iVar12) {
            if (*piVar23 + numECCodewords != iVar12) {
              if (iVar12 - numECCodewords == 0 || iVar12 < numECCodewords) goto LAB_00178cb4;
              *piVar23 = iVar12 - numECCodewords;
            }
            Decode((DecoderResult *)local_250,local_348);
            lVar26 = (long)(numECCodewords * 100) /
                     (long)(int)((ulong)((long)(pvVar10->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)(pvVar10->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_start) >> 2);
            uVar15 = (uint)lVar26;
            uVar14 = -uVar15;
            if (0 < (int)uVar15) {
              uVar14 = uVar15;
            }
            __len = 1;
            if (9 < uVar14) {
              uVar18 = (ulong)uVar14;
              uVar11 = 4;
              do {
                __len = uVar11;
                uVar17 = (uint)uVar18;
                if (uVar17 < 100) {
                  __len = __len - 2;
                  goto LAB_00178ebe;
                }
                if (uVar17 < 1000) {
                  __len = __len - 1;
                  goto LAB_00178ebe;
                }
                if (uVar17 < 10000) goto LAB_00178ebe;
                uVar18 = uVar18 / 10000;
                uVar11 = __len + 4;
              } while (99999 < uVar17);
              __len = __len + 1;
            }
LAB_00178ebe:
            local_3e8._0_8_ = (ModulusGF *)(local_3e8 + 0x10);
            std::__cxx11::string::_M_construct
                      ((ulong)local_3e8,(char)__len - ((char)((ulong)lVar26 >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((long)(int *)local_3e8._0_8_ + (ulong)(uVar15 >> 0x1f)),__len,uVar14
                      );
            puVar16 = (undefined8 *)std::__cxx11::string::append(local_3e8);
            pMVar22 = (ModulusGF *)(puVar16 + 2);
            if ((ModulusGF *)*puVar16 == pMVar22) {
              local_408._16_8_ = *(undefined8 *)pMVar22;
              piStack_3f0 = (pointer)puVar16[3];
              local_408._0_8_ = (ModulusGF *)(local_408 + 0x10);
            }
            else {
              local_408._16_8_ = *(undefined8 *)pMVar22;
              local_408._0_8_ = (ModulusGF *)*puVar16;
            }
            local_408._8_8_ = puVar16[1];
            *puVar16 = pMVar22;
            puVar16[1] = 0;
            *(undefined1 *)(puVar16 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_218,(string *)local_408);
            DecoderResult::DecoderResult(__return_storage_ptr__,(DecoderResult *)local_250);
            if ((ModulusGF *)local_408._0_8_ != (ModulusGF *)(local_408 + 0x10)) {
              operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
            }
            if ((ModulusGF *)local_3e8._0_8_ != (ModulusGF *)(local_3e8 + 0x10)) {
              operator_delete((void *)local_3e8._0_8_,local_3e8._16_8_ + 1);
            }
            if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_p != local_1b0) {
              operator_delete(local_1c0._M_p,local_1b0[0]._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_p != &local_1d8) {
              operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_p != local_208) {
              operator_delete(local_218._M_p,local_208[0]._M_allocated_capacity + 1);
            }
            if ((pointer)local_250._24_8_ != (pointer)0x0) {
              operator_delete((void *)local_250._24_8_,local_250._40_8_ - local_250._24_8_);
            }
            if ((ModulusGF *)local_250._0_8_ == (ModulusGF *)0x0) {
              return __return_storage_ptr__;
            }
            uVar18 = local_250._16_8_ - local_250._0_8_;
            pMVar22 = (ModulusGF *)local_250._0_8_;
            goto LAB_00178e12;
          }
        }
LAB_00178cb4:
        local_138 = 0;
        paVar1 = &local_c0._msg.field_2;
        local_c0._msg.field_2._M_local_buf[0] = '\0';
        local_c0._msg.field_2._M_allocated_capacity._1_7_ = local_130._1_7_;
        local_c0._msg.field_2._9_4_ = local_130._9_4_;
        local_c0._msg.field_2._13_2_ = local_130._13_2_;
        local_c0._msg.field_2._M_local_buf[0xf] = local_130[0xf];
        local_c0._msg._M_string_length = 0;
        local_130[0] = 0;
        local_c0._file = "src/pdf417/PDFScanningDecoder.cpp";
        local_c0._line = 0x243;
        local_c0._type = Format;
        local_140 = (ModulusGF *)local_130;
        local_c0._msg._M_dataplus._M_p = (pointer)paVar1;
        DecoderResult::DecoderResult(local_258,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._msg._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._msg._M_dataplus._M_p,
                          CONCAT71(local_c0._msg.field_2._M_allocated_capacity._1_7_,
                                   local_c0._msg.field_2._M_local_buf[0]) + 1);
        }
        if (local_140 == (ModulusGF *)local_130) {
          return __return_storage_ptr__;
        }
        lVar26 = CONCAT71(local_130._1_7_,local_130[0]);
        pMVar22 = local_140;
        goto LAB_00178e0f;
      }
    }
    local_130._24_8_ = (pointer)0x0;
    paVar1 = &local_90._msg.field_2;
    local_90._msg.field_2._M_local_buf[0] = '\0';
    local_90._msg.field_2._M_allocated_capacity._1_7_ = uStack_10f;
    local_90._msg.field_2._9_4_ = local_107;
    local_90._msg.field_2._13_2_ = local_103;
    local_90._msg.field_2._M_local_buf[0xf] = local_101;
    local_90._msg._M_string_length = 0;
    local_130[0x20] = 0;
    local_90._file = "src/pdf417/PDFScanningDecoder.cpp";
    local_90._line = 0x240;
    local_90._type = Checksum;
    local_130._16_8_ = (ModulusGF *)(local_130 + 0x20);
    local_90._msg._M_dataplus._M_p = (pointer)paVar1;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._msg._M_dataplus._M_p,
                      CONCAT71(local_90._msg.field_2._M_allocated_capacity._1_7_,
                               local_90._msg.field_2._M_local_buf[0]) + 1);
    }
    if ((ModulusGF *)local_130._16_8_ == (ModulusGF *)(local_130 + 0x20)) {
      return __return_storage_ptr__;
    }
    lVar26 = CONCAT71(uStack_10f,local_130[0x20]);
    pMVar22 = (ModulusGF *)local_130._16_8_;
  }
LAB_00178e0f:
  uVar18 = lVar26 + 1;
LAB_00178e12:
  operator_delete(pMVar22,uVar18);
  return __return_storage_ptr__;
}

Assistant:

static DecoderResult DecodeCodewords(std::vector<int>& codewords, int numECCodewords, const std::vector<int>& erasures)
{
	if (codewords.empty())
		return FormatError();

	int correctedErrorsCount = 0;
	if (!CorrectErrors(codewords, erasures, numECCodewords, correctedErrorsCount))
		return ChecksumError();

	if (!VerifyCodewordCount(codewords, numECCodewords))
		return FormatError();

	// Decode the codewords
	return Decode(codewords).setEcLevel(std::to_string(numECCodewords * 100 / Size(codewords)) + "%");
}